

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O1

void expand_sha1(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                uint32_t len)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  uint uVar4;
  uint8_t *data;
  uint8_t *data_00;
  ulong __n;
  long lVar5;
  uint8_t *puVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong __n_00;
  uint8_t *dst;
  uint8_t uVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 uStack_80;
  ulong local_78;
  uint8_t *local_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  uint32_t local_4c;
  uint8_t *local_48;
  uint8_t *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  __n_00 = (ulong)infolen;
  local_78 = (ulong)len / 0x14;
  local_60 = (ulong)((len / 0x14) * 4);
  __n = (ulong)(infolen + 0x15);
  uVar11 = __n + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar11;
  dst = (uint8_t *)((long)&local_78 + lVar1);
  local_70 = okm;
  local_68 = __n;
  local_48 = prk;
  local_40 = info;
  local_38 = len;
  local_34 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17b979;
  memset(dst,0,__n);
  puVar6 = local_40;
  data_00 = (uint8_t *)((long)&local_68 + (4 - uVar11));
  local_58 = __n_00;
  local_40 = (uint8_t *)__n_00;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17b99b;
  memcpy(data_00,puVar6,__n_00);
  if (0x13 < local_38) {
    local_4c = (int)local_58 + 1;
    lVar2 = local_60 * 5;
    uVar9 = '\x01';
    lVar5 = 0;
    do {
      data_00[(long)local_40] = uVar9;
      uVar8 = local_34;
      puVar6 = local_48;
      data = data_00;
      uVar7 = local_4c;
      if (lVar5 != 0) {
        data = dst;
        uVar7 = (uint32_t)local_68;
      }
      *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17b9ea;
      EverCrypt_HMAC_compute_sha1(dst,puVar6,uVar8,data,uVar7);
      *(undefined4 *)(local_70 + lVar5 + 0x10) = *(undefined4 *)((long)&local_68 + lVar1);
      uVar3 = *(undefined8 *)((long)&local_70 + lVar1);
      *(undefined8 *)(local_70 + lVar5) = *(undefined8 *)dst;
      *(undefined8 *)(local_70 + lVar5 + 8) = uVar3;
      lVar5 = lVar5 + 0x14;
      uVar9 = uVar9 + '\x01';
    } while (lVar2 != lVar5);
  }
  uVar8 = local_38;
  uVar4 = (int)local_60 * 5;
  if (uVar4 < local_38) {
    uVar10 = local_38 + (int)local_60 * -5;
    data_00[(long)local_40] = (char)local_78 + '\x01';
    uVar7 = local_34;
    puVar6 = local_48;
    if (uVar8 < 0x14) {
      uVar8 = (int)local_58 + 1;
    }
    else {
      uVar8 = (uint32_t)local_68;
      data_00 = dst;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17ba61;
    EverCrypt_HMAC_compute_sha1(dst,puVar6,uVar7,data_00,uVar8);
    puVar6 = local_70 + uVar4;
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17ba75;
    memcpy(puVar6,dst,(ulong)uVar10);
  }
  return;
}

Assistant:

static void
expand_sha1(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 20U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}